

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O2

Violation __thiscall
mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::
ComputeViolation<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>> *this,
          VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  int i;
  double dVar1;
  bool bVar2;
  uint uVar3;
  Violation VVar4;
  
  dVar1 = AlgebraicExpression<mp::LinTerms>::
          ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    ((AlgebraicExpression<mp::LinTerms> *)(this + 0x20),x);
  VVar4.viol_._0_4_ = SUB84(dVar1,0);
  uVar3 = (uint)((ulong)dVar1 >> 0x20);
  i = *(int *)(this + 0xa0);
  if ((x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[i] - (x->lb_).data_[i] <= x->feastol_) {
    uVar3 = uVar3 ^ 0x80000000;
  }
  else {
    bVar2 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::is_at_ub(x,i);
    if (!bVar2) {
      uVar3 = uVar3 & 0x7fffffff;
    }
  }
  VVar4.viol_._4_4_ = uVar3;
  VVar4.valX_ = 0.0;
  return VVar4;
}

Assistant:

Violation ComputeViolation(const VarInfo& x) const {
    auto ve = compl_expr_.ComputeValue(x);
    if (x.is_at_lb(compl_var_))
      return {-ve, 0.0};
    else if (x.is_at_ub(compl_var_))
      return {ve, 0.0};
    return {std::fabs(ve), 0.0};
  }